

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_30ceb::time_zone_setter::time_zone_setter(time_zone_setter *this,czstring tz)

{
  not_null<const_char_*> __value;
  char *pcVar1;
  int __replace;
  allocator local_49;
  not_null<const_char_*> local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pcVar1 = getenv("TZ");
  if (pcVar1 == (char *)0x0) {
    *(undefined8 *)((long)&(this->old_).storage_ + 8) = 0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x10) = 0;
    *(undefined8 *)&this->old_ = 0;
    (this->old_).storage_.__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&(this->old_).storage_ + 0x18) = 0;
  }
  else {
    std::__cxx11::string::string((string *)&local_40,pcVar1,&local_49);
    pstore::maybe<std::__cxx11::string,void>::maybe<std::__cxx11::string,void>
              ((maybe<std::__cxx11::string,void> *)this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
  }
  local_48.ptr_ = tz;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_48);
  __value.ptr_ = local_48.ptr_;
  local_40._M_dataplus._M_p = "TZ";
  pstore::gsl::not_null<const_char_*>::ensure_invariant((not_null<const_char_*> *)&local_40);
  setenv(local_40._M_dataplus._M_p,__value.ptr_,__replace);
  return;
}

Assistant:

time_zone_setter::time_zone_setter (czstring tz)
            : old_ (time_zone_setter::tz_value ()) {
        time_zone_setter::set_tz (tz);
    }